

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_type_pattern_check(ly_ctx *ctx,char *pattern,pcre2_code_8 **code)

{
  char *__s;
  undefined *puVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *__haystack;
  long lVar6;
  pcre2_code_8 *ppVar7;
  char cVar8;
  LY_ERR LVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int err_code;
  char *local_150;
  pcre2_code_8 **local_148;
  size_t err_offset;
  PCRE2_UCHAR8 err_msg [256];
  
  sVar5 = strlen(pattern);
  sVar5 = sVar5 + 1;
  __haystack = (char *)malloc(sVar5);
  if (__haystack == (char *)0x0) {
LAB_00143423:
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_pattern_check")
    ;
    return LY_EMEM;
  }
  *__haystack = '\0';
  lVar11 = 0;
  lVar15 = 0;
  pcVar10 = pattern;
  local_148 = code;
  do {
    bVar3 = false;
LAB_001431d0:
    cVar8 = *pcVar10;
    switch(cVar8) {
    case '[':
      lVar11 = lVar11 + (ulong)!bVar3;
      cVar8 = '[';
      break;
    case '\\':
      goto switchD_001431e5_caseD_5c;
    case ']':
      if (bVar3 || lVar11 != 0) {
        lVar11 = lVar11 - (ulong)!bVar3;
        cVar8 = ']';
        break;
      }
      pcVar12 = "character group doesn\'t begin with \'[\'";
      goto LAB_0014355e;
    default:
      if (cVar8 == '\0') {
        __haystack[lVar15] = '\0';
        goto LAB_0014327b;
      }
      if (cVar8 != '$') break;
    case '^':
      if (lVar11 != 0) break;
      sVar5 = sVar5 + 1;
      __haystack = (char *)ly_realloc(__haystack,sVar5);
      if (__haystack == (char *)0x0) goto LAB_00143423;
      __haystack[lVar15] = '\\';
      lVar15 = lVar15 + 1;
      cVar8 = *pcVar10;
      lVar11 = 0;
    }
    __haystack[lVar15] = cVar8;
    lVar15 = lVar15 + 1;
    pcVar10 = pcVar10 + 1;
  } while( true );
LAB_0014327b:
  pcVar10 = strstr(__haystack,"\\p{Is");
  if (pcVar10 == (char *)0x0) {
    ppVar7 = (pcre2_code_8 *)
             pcre2_compile_8(__haystack,0xffffffffffffffff,0xa00a2010,&err_code,&err_offset,0);
    if (ppVar7 == (pcre2_code_8 *)0x0) {
      pcVar12 = (char *)err_msg;
      memset(pcVar12,0,0x100);
      pcre2_get_error_message_8(err_code,pcVar12,0x100);
      pcVar10 = __haystack + err_offset;
LAB_0014355e:
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
              "Regular expression \"%s\" is not valid (\"%s\": %s).",pattern,pcVar10,pcVar12);
      free(__haystack);
      LVar9 = LY_EVALID;
    }
    else {
      free(__haystack);
      if (local_148 == (pcre2_code_8 **)0x0) {
        pcre2_code_free_8(ppVar7);
      }
      else {
        *local_148 = ppVar7;
      }
      LVar9 = LY_SUCCESS;
    }
    return LVar9;
  }
  lVar11 = (long)pcVar10 - (long)__haystack;
  pcVar10 = strchr(pcVar10,0x7d);
  if (pcVar10 == (char *)0x0) {
    pcVar12 = __haystack + lVar11 + 2;
    pcVar10 = "unterminated character property";
LAB_0014340f:
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,"Regular expression \"%s\" is not valid (\"%s\": %s).",
            pattern,pcVar12,pcVar10);
    LVar9 = LY_EVALID;
LAB_00143419:
    free(__haystack);
    return LVar9;
  }
  lVar15 = 1 - (long)__haystack;
  uVar13 = (long)(pcVar10 + lVar15) - lVar11;
  if (uVar13 < 0x13) {
    sVar5 = strlen(__haystack);
    __haystack = (char *)ly_realloc(__haystack,(sVar5 - uVar13) + 0x14);
    if (__haystack == (char *)0x0) {
      __haystack = (char *)0x0;
      LVar9 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_pattern_chblocks_xmlschema2perl");
      goto LAB_00143419;
    }
  }
  local_150 = __haystack + lVar11;
  pcVar12 = __haystack + lVar11 + 5;
  lVar6 = 0;
  do {
    if (lVar6 + 0x10 == 0x550) {
      pcVar10 = "unknown block name";
      goto LAB_0014340f;
    }
    __s = *(char **)((long)&PTR_anon_var_dwarf_6a876_001faa40 + lVar6);
    sVar5 = strlen(__s);
    iVar4 = strncmp(pcVar12,__s,sVar5);
    lVar6 = lVar6 + 0x10;
  } while (iVar4 != 0);
  lVar14 = 0;
  for (lVar6 = 0; lVar11 != lVar6; lVar6 = lVar6 + 1) {
    if (__haystack[lVar6] == ']') {
      if ((lVar6 == 0) || (__haystack[lVar6 + -1] != '\\')) {
        lVar14 = lVar14 + -1;
      }
    }
    else if ((__haystack[lVar6] == '[') && ((lVar6 == 0 || (__haystack[lVar6 + -1] != '\\')))) {
      lVar14 = lVar14 + 1;
    }
  }
  pcVar12 = __haystack + (long)(pcVar10 + lVar15);
  sVar5 = strlen(pcVar12);
  pcVar10 = local_150;
  if (lVar14 == 0) {
    memmove(local_150 + 0x13,pcVar12,sVar5 + 1);
    builtin_strncpy(pcVar10,"[\\x{0000}-\\x{007F}]",0x13);
  }
  else {
    memmove(local_150 + 0x11,pcVar12,sVar5 + 1);
    puVar1 = (&PTR_anon_var_dwarf_6a881_001faa48)[lVar14 * 2];
    uVar2 = *(undefined8 *)(puVar1 + 9);
    *(undefined8 *)pcVar10 = *(undefined8 *)(puVar1 + 1);
    *(undefined8 *)(pcVar10 + 8) = uVar2;
    pcVar10[0x10] = puVar1[0x11];
  }
  goto LAB_0014327b;
switchD_001431e5_caseD_5c:
  bVar3 = (bool)(bVar3 ^ 1);
  __haystack[lVar15] = '\\';
  lVar15 = lVar15 + 1;
  pcVar10 = pcVar10 + 1;
  goto LAB_001431d0;
}

Assistant:

LY_ERR
lys_compile_type_pattern_check(const struct ly_ctx *ctx, const char *pattern, pcre2_code **code)
{
    size_t idx, size, brack;
    char *perl_regex;
    int err_code, compile_opts;
    const char *orig_ptr;
    PCRE2_SIZE err_offset;
    pcre2_code *code_local;
    ly_bool escaped;
    LY_ERR r;

    /* adjust the expression to a Perl equivalent
     * http://www.w3.org/TR/2004/REC-xmlschema-2-20041028/#regexs */

    /* allocate space for the transformed pattern */
    size = strlen(pattern) + 1;
    compile_opts = PCRE2_UTF | PCRE2_UCP | PCRE2_ANCHORED | PCRE2_DOLLAR_ENDONLY | PCRE2_NO_AUTO_CAPTURE;
#ifdef PCRE2_ENDANCHORED
    compile_opts |= PCRE2_ENDANCHORED;
#else
    /* add space for trailing $ anchor */
    size++;
#endif
    perl_regex = malloc(size);
    LY_CHECK_ERR_RET(!perl_regex, LOGMEM(ctx), LY_EMEM);
    perl_regex[0] = '\0';

    /* we need to replace all "$" and "^" (that are not in "[]") with "\$" and "\^" */
    brack = 0;
    idx = 0;
    escaped = 0;
    orig_ptr = pattern;
    while (orig_ptr[0]) {
        switch (orig_ptr[0]) {
        case '$':
        case '^':
            if (!brack) {
                /* make space for the extra character */
                ++size;
                perl_regex = ly_realloc(perl_regex, size);
                LY_CHECK_ERR_RET(!perl_regex, LOGMEM(ctx), LY_EMEM);

                /* print escape slash */
                perl_regex[idx] = '\\';
                ++idx;
            }
            break;
        case '\\':
            /*  escape character found or backslash is escaped */
            escaped = !escaped;
            /* copy backslash and continue with the next character */
            perl_regex[idx] = orig_ptr[0];
            ++idx;
            ++orig_ptr;
            continue;
        case '[':
            if (!escaped) {
                ++brack;
            }
            break;
        case ']':
            if (!brack && !escaped) {
                /* If ']' does not terminate a character class expression, then pcre2_compile() implicitly escapes the
                 * ']' character. But this seems to be against the regular expressions rules declared in
                 * "XML schema: Datatypes" and therefore an error is returned. So for example if pattern is '\[a]' then
                 * pcre2 match characters '[a]' literally but in YANG such pattern is not allowed.
                 */
                LOGVAL(ctx, LY_VCODE_INREGEXP, pattern, orig_ptr, "character group doesn't begin with '['");
                free(perl_regex);
                return LY_EVALID;
            } else if (!escaped) {
                --brack;
            }
            break;
        default:
            break;
        }

        /* copy char */
        perl_regex[idx] = orig_ptr[0];

        ++idx;
        ++orig_ptr;
        escaped = 0;
    }
#ifndef PCRE2_ENDANCHORED
    /* anchor match to end of subject */
    perl_regex[idx++] = '$';
#endif
    perl_regex[idx] = '\0';

    /* transform character blocks */
    if ((r = lys_compile_pattern_chblocks_xmlschema2perl(ctx, pattern, &perl_regex))) {
        free(perl_regex);
        return r;
    }

    /* must return 0, already checked during parsing */
    code_local = pcre2_compile((PCRE2_SPTR)perl_regex, PCRE2_ZERO_TERMINATED, compile_opts,
            &err_code, &err_offset, NULL);
    if (!code_local) {
        PCRE2_UCHAR err_msg[LY_PCRE2_MSG_LIMIT] = {0};

        pcre2_get_error_message(err_code, err_msg, LY_PCRE2_MSG_LIMIT);
        LOGVAL(ctx, LY_VCODE_INREGEXP, pattern, perl_regex + err_offset, err_msg);
        free(perl_regex);
        return LY_EVALID;
    }
    free(perl_regex);

    if (code) {
        *code = code_local;
    } else {
        pcre2_code_free(code_local);
    }

    return LY_SUCCESS;

#undef URANGE_LEN
}